

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O0

uint64_t __thiscall
basisu::etc_block::evaluate_etc1_error
          (etc_block *this,color_rgba *pBlock_pixels,bool perceptual,int subblock_index)

{
  bool bVar1;
  uint32_t uVar2;
  anon_union_4_2_6eba8969_for_color_rgba_0 in_ECX;
  byte in_DL;
  etc_block *in_RDI;
  uint32_t idx;
  uint32_t i_1;
  bool flip_bit;
  uint32_t i;
  uint64_t total_error;
  color_rgba unpacked_block [16];
  anon_union_4_2_6eba8969_for_color_rgba_0 *this_00;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff9c;
  uint uVar4;
  uint64_t uVar5;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_58 [16];
  anon_union_4_2_6eba8969_for_color_rgba_0 local_18;
  byte local_11;
  
  local_11 = in_DL & 1;
  this_00 = local_58;
  local_18 = in_ECX;
  do {
    color_rgba::color_rgba((color_rgba *)&this_00->field_1);
    this_00 = this_00 + 1;
  } while (this_00 != &local_18);
  unpack_etc1((etc_block *)unpacked_block._8_8_,(color_rgba *)unpacked_block._0_8_,total_error._7_1_
             );
  uVar5 = 0;
  if ((int)local_18 < 0) {
    for (uVar4 = 0; uVar4 < 0x10; uVar4 = uVar4 + 1) {
      uVar2 = color_distance(SUB81(uVar5 >> 0x18,0),
                             (color_rgba *)CONCAT44(uVar4,in_stack_ffffffffffffff98),
                             (color_rgba *)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                             SUB81((ulong)this_00 >> 0x38,0));
      uVar5 = uVar2 + uVar5;
    }
  }
  else {
    bVar1 = get_flip_bit(in_RDI);
    uVar3 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff98);
    for (uVar4 = 0; uVar4 < 8; uVar4 = uVar4 + 1) {
      uVar2 = color_distance(SUB81(uVar5 >> 0x18,0),
                             (color_rgba *)CONCAT44(in_stack_ffffffffffffff9c,uVar3),
                             (color_rgba *)
                             CONCAT44(uVar4,*(undefined4 *)
                                             (g_etc1_pixel_indices +
                                             (ulong)uVar4 * 4 +
                                             (long)(int)local_18 * 0x20 +
                                             (ulong)((byte)((uint)uVar3 >> 0x18) & 1) * 0x40)),
                             SUB81((ulong)this_00 >> 0x38,0));
      uVar5 = uVar2 + uVar5;
    }
  }
  return uVar5;
}

Assistant:

uint64_t etc_block::evaluate_etc1_error(const color_rgba* pBlock_pixels, bool perceptual, int subblock_index) const
	{
		color_rgba unpacked_block[16];

		unpack_etc1(*this, unpacked_block);

		uint64_t total_error = 0;

		if (subblock_index < 0)
		{
			for (uint32_t i = 0; i < 16; i++)
				total_error += color_distance(perceptual, pBlock_pixels[i], unpacked_block[i], false);
		}
		else
		{
			const bool flip_bit = get_flip_bit();

			for (uint32_t i = 0; i < 8; i++)
			{
				const uint32_t idx = g_etc1_pixel_indices[flip_bit][subblock_index][i];

				total_error += color_distance(perceptual, pBlock_pixels[idx], unpacked_block[idx], false);
			}
		}

		return total_error;
	}